

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall
Centaurus::NFABaseState<char,_int>::print_subgraph
          (NFABaseState<char,_int> *this,wostream *os,int from,wstring *prefix)

{
  pointer pNVar1;
  wostream *pwVar2;
  wchar_t *pwVar3;
  NFATransition<char> *t;
  pointer pNVar4;
  
  pNVar1 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pNVar4 = (this->m_transitions).
                super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar4 != pNVar1; pNVar4 = pNVar4 + 1) {
    pwVar2 = std::operator<<(os,(wstring *)prefix);
    pwVar2 = std::operator<<(pwVar2,L"_S");
    pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,from);
    pwVar2 = std::operator<<(pwVar2,L" -> ");
    pwVar2 = std::operator<<(pwVar2,(wstring *)prefix);
    pwVar2 = std::operator<<(pwVar2,L"_S");
    pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,pNVar4->m_dest);
    std::operator<<(pwVar2,L" [ label=\"");
    operator<<(os,&pNVar4->m_label);
    pwVar3 = L"\" ];";
    if (pNVar4->m_long != false) {
      pwVar3 = L"\", penwidth=3, arrowsize=3 ];";
    }
    pwVar2 = std::operator<<(os,pwVar3);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  }
  return;
}

Assistant:

void print_subgraph(std::wostream& os, int from, const std::wstring& prefix) const
	{
		for (const auto& t : m_transitions)
		{
			os << prefix << L"_S" << from << L" -> " << prefix << L"_S" << t.dest() << L" [ label=\"";
			os << t.label();
            if (!t.is_long())
            {
                os << L"\" ];" << std::endl;
            }
            else
            {
                os << L"\", penwidth=3, arrowsize=3 ];" << std::endl;
            }
		}
	}